

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workWithFilesAndCiphertext.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
fileToDWORDmas(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
              string *filePath)

{
  ulong uVar1;
  ulong uVar2;
  ifstream fs;
  long local_218 [4];
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(local_218,(string *)filePath,_S_out|_S_bin);
  if ((abStack_1f8[*(long *)(local_218[0] + -0x18)] & 5) == 0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::istream::seekg((long)local_218,_S_beg);
    uVar1 = std::istream::tellg();
    std::istream::seekg((long)local_218,_S_beg);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (__return_storage_ptr__,(uVar1 >> 2) + 1);
    std::istream::read((char *)local_218,
                       (long)(__return_storage_ptr__->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start);
    uVar1 = (long)(__return_storage_ptr__->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    uVar2 = uVar1 & 3;
    if (uVar2 != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (__return_storage_ptr__,uVar2 + uVar1);
    }
    std::ifstream::~ifstream(local_218);
    return __return_storage_ptr__;
  }
  exit(1);
}

Assistant:

std::vector<unsigned> fileToDWORDmas(const std::string &filePath) {
    std::ifstream fs(filePath, std::ios_base::out | std::ios_base::binary);
    if (fs.fail()) {
        exit(1);
    }

    std::vector<unsigned> arr;
    fs.seekg(0, std::ios::end);
    auto fileSize = fs.tellg();
    fs.seekg(0, std::ios::beg);

    auto sizeOfBuffer = fileSize / sizeof(unsigned);

    arr.resize(static_cast<unsigned long>(sizeOfBuffer + 1));
    fs.read(reinterpret_cast<char *>(arr.data()), fileSize);

    if (arr.size() % 4 != 0)
        arr.resize(arr.size() + arr.size() % 4);
    return arr;
}